

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O1

int TextEndsWithNewline(Lexer *lexer,Node *node,uint mode)

{
  uint uVar1;
  uint uVar2;
  Bool BVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  byte *pbVar8;
  
  if (((mode & 0x12) != 0) && (BVar3 = prvTidynodeIsText(node), BVar3 != no)) {
    uVar1 = node->start;
    uVar2 = node->end;
    if (uVar1 < uVar2) {
      uVar4 = uVar2 - 1;
      uVar7 = uVar2;
      if (uVar1 < uVar4) {
        uVar7 = uVar1 + 1;
        pbVar8 = (byte *)(lexer->lexbuf + uVar4);
        uVar5 = uVar2;
        do {
          if ((0x20 < (ulong)*pbVar8) || ((0x100002200U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0)) {
            uVar4 = uVar5 - 1;
            uVar7 = uVar5;
            break;
          }
          uVar6 = uVar5 - 2;
          pbVar8 = pbVar8 + -1;
          uVar4 = uVar1;
          uVar5 = uVar5 - 1;
        } while (uVar1 < uVar6);
      }
      if (lexer->lexbuf[uVar4] == '\n') {
        return uVar2 - uVar7;
      }
    }
  }
  return -1;
}

Assistant:

static int TextEndsWithNewline(Lexer *lexer, Node *node, uint mode )
{
    if ( (mode & (CDATA|COMMENT)) && TY_(nodeIsText)(node) && node->end > node->start )
    {
        uint ch, ix = node->end - 1;
        /*\
         *  Skip non-newline whitespace.
         *  Issue #379 - Only if ix is GT start can it be decremented!
        \*/
        while ( ix > node->start && (ch = (lexer->lexbuf[ix] & 0xff))
                 && ( ch == ' ' || ch == '\t' || ch == '\r' ) )
            --ix;

        if ( lexer->lexbuf[ ix ] == '\n' )
          return node->end - ix - 1; /* #543262 tidy eats all memory */
    }
    return -1;
}